

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O3

uint32_t helper_ctpop_i32_riscv64(uint32_t arg)

{
  uint uVar1;
  
  uVar1 = arg - (arg >> 1 & 0x55555555);
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
  return ((uVar1 >> 4) + uVar1 & 0xf0f0f0f) * 0x1010101 >> 0x18;
}

Assistant:

static inline int ctpop32(uint32_t val)
{
#ifndef _MSC_VER
    return __builtin_popcount(val);
#else
    val = (val & 0x55555555) + ((val >>  1) & 0x55555555);
    val = (val & 0x33333333) + ((val >>  2) & 0x33333333);
    val = (val & 0x0f0f0f0f) + ((val >>  4) & 0x0f0f0f0f);
    val = (val & 0x00ff00ff) + ((val >>  8) & 0x00ff00ff);
    val = (val & 0x0000ffff) + ((val >> 16) & 0x0000ffff);

    return val;
#endif
}